

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O0

void sys_findprogdir(char *progname)

{
  int iVar1;
  undefined1 local_880 [8];
  stat statbuf;
  char *lastslash;
  char sbuf2 [1000];
  char local_3f8 [8];
  char sbuf [1000];
  char *progname_local;
  
  sbuf._992_8_ = progname;
  strncpy(local_3f8,progname,1000);
  sbuf[0x3df] = '\0';
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)strrchr(local_3f8,0x2f);
  if ((char *)statbuf.__glibc_reserved[2] == (char *)0x0) {
    strcpy((char *)&lastslash,".");
  }
  else {
    *(char *)statbuf.__glibc_reserved[2] = '\0';
    statbuf.__glibc_reserved[2] = (__syscall_slong_t)strrchr(local_3f8,0x2f);
    if ((char *)statbuf.__glibc_reserved[2] == (char *)0x0) {
      strcpy((char *)&lastslash,"..");
    }
    else {
      strncpy((char *)&lastslash,local_3f8,statbuf.__glibc_reserved[2] - (long)local_3f8);
      *(undefined1 *)(statbuf.__glibc_reserved[2] + -0x3f0) = 0;
    }
  }
  strncpy(local_3f8,(char *)&lastslash,0x3ca);
  sbuf[0x3c2] = '\0';
  strcat(local_3f8,"/lib/pd");
  iVar1 = stat(local_3f8,(stat *)local_880);
  if (iVar1 < 0) {
    sys_libdir = gensym((char *)&lastslash);
  }
  else {
    sys_libdir = gensym(local_3f8);
  }
  return;
}

Assistant:

void sys_findprogdir(const char *progname)
{
    char sbuf[MAXPDSTRING], sbuf2[MAXPDSTRING];
    char *lastslash;
#ifndef _WIN32
    struct stat statbuf;
#endif /* NOT _WIN32 */

    /* find out by what string Pd was invoked; put answer in "sbuf". */
#ifdef _WIN32
    GetModuleFileName(NULL, sbuf2, sizeof(sbuf2));
    sbuf2[MAXPDSTRING-1] = 0;
    sys_unbashfilename(sbuf2, sbuf);
#else
    strncpy(sbuf, progname, MAXPDSTRING);
    sbuf[MAXPDSTRING-1] = 0;
#endif /* _WIN32 */
    lastslash = strrchr(sbuf, '/');
    if (lastslash)
    {
            /* bash last slash to zero so that sbuf is directory pd was in,
                e.g., ~/pd/bin */
        *lastslash = 0;
            /* go back to the parent from there, e.g., ~/pd */
        lastslash = strrchr(sbuf, '/');
        if (lastslash)
        {
            strncpy(sbuf2, sbuf, lastslash-sbuf);
            sbuf2[lastslash-sbuf] = 0;
        }
        else strcpy(sbuf2, "..");
    }
    else
    {
            /* no slashes found.  Try INSTALL_PREFIX. */
#ifdef INSTALL_PREFIX
        strcpy(sbuf2, INSTALL_PREFIX);
#else
        strcpy(sbuf2, ".");
#endif
    }
        /* now we believe sbuf2 holds the parent directory of the directory
        pd was found in.  We now want to infer the "lib" directory and the
        "gui" directory.  In "simple" unix installations, the layout is
            .../bin/pd
            .../bin/pd-watchdog (etc)
            .../bin/pd-gui.tcl
            .../doc
        and in "complicated" unix installations, it's:
            .../bin/pd
            .../lib/pd/bin/pd-watchdog
            .../lib/pd/bin/pd-gui.tcl
            .../lib/pd/doc
        To decide which, we stat .../lib/pd; if that exists, we assume it's
        the complicated layout.  In MSW, it's the "simple" layout, but
        "wish" is found in bin:
            .../bin/pd
            .../bin/wish80.exe
            .../doc
        */
#ifdef _WIN32
    sys_libdir = gensym(sbuf2);
#else
    strncpy(sbuf, sbuf2, MAXPDSTRING-30);
    sbuf[MAXPDSTRING-30] = 0;
    strcat(sbuf, "/lib/pd");
    if (stat(sbuf, &statbuf) >= 0)
    {
            /* complicated layout: lib dir is the one we just stat-ed above */
        sys_libdir = gensym(sbuf);
    }
    else
    {
            /* simple layout: lib dir is the parent */
        sys_libdir = gensym(sbuf2);
    }
#endif
}